

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int inflateStateCheck(z_streamp strm)

{
  internal_state *piVar1;
  
  if ((((strm != (z_streamp)0x0) && (strm->zalloc != (alloc_func)0x0)) &&
      (strm->zfree != (free_func)0x0)) &&
     ((piVar1 = strm->state, piVar1 != (internal_state *)0x0 && (*(z_streamp *)piVar1 == strm)))) {
    return (int)(*(int *)(piVar1 + 8) - 0x3f54U < 0xffffffe0);
  }
  return 1;
}

Assistant:

local int inflateStateCheck(z_streamp strm) {
    struct inflate_state FAR *state;
    if (strm == Z_NULL ||
        strm->zalloc == (alloc_func)0 || strm->zfree == (free_func)0)
        return 1;
    state = (struct inflate_state FAR *)strm->state;
    if (state == Z_NULL || state->strm != strm ||
        state->mode < HEAD || state->mode > SYNC)
        return 1;
    return 0;
}